

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslTokenStream.cpp
# Opt level: O1

void __thiscall
glslang::HlslTokenStream::pushTokenStream(HlslTokenStream *this,TVector<glslang::HlslToken> *tokens)

{
  HlslToken *__args;
  pointer *pppTVar1;
  pointer *ppHVar2;
  iterator __position;
  iterator __position_00;
  pointer pHVar3;
  iterator __position_01;
  TString *pTVar4;
  undefined4 uVar5;
  EHlslTokenClass EVar6;
  undefined4 uVar7;
  int iVar8;
  int iVar9;
  TVector<glslang::HlslToken> *local_20;
  int local_14;
  
  local_20 = tokens;
  if (this->preTokenStackSize == 0) {
    __args = &this->token;
    __position._M_current =
         (this->currentTokenStack).
         super_vector<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>.
         super__Vector_base<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->currentTokenStack).
        super_vector<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>.
        super__Vector_base<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage) {
      std::vector<glslang::HlslToken,glslang::pool_allocator<glslang::HlslToken>>::
      _M_realloc_insert<glslang::HlslToken_const&>
                ((vector<glslang::HlslToken,glslang::pool_allocator<glslang::HlslToken>> *)
                 &this->currentTokenStack,__position,__args);
    }
    else {
      (__position._M_current)->field_2 = (this->token).field_2;
      pTVar4 = (__args->loc).name;
      iVar8 = (this->token).loc.string;
      iVar9 = (this->token).loc.line;
      uVar5 = *(undefined4 *)&(this->token).loc.field_0x14;
      EVar6 = (this->token).tokenClass;
      uVar7 = *(undefined4 *)&(this->token).field_0x1c;
      ((__position._M_current)->loc).column = (this->token).loc.column;
      *(undefined4 *)&((__position._M_current)->loc).field_0x14 = uVar5;
      (__position._M_current)->tokenClass = EVar6;
      *(undefined4 *)&(__position._M_current)->field_0x1c = uVar7;
      ((__position._M_current)->loc).name = pTVar4;
      ((__position._M_current)->loc).string = iVar8;
      ((__position._M_current)->loc).line = iVar9;
      ppHVar2 = &(this->currentTokenStack).
                 super_vector<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>.
                 super__Vector_base<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppHVar2 = *ppHVar2 + 1;
    }
    __position_00._M_current =
         (this->tokenStreamStack).
         super_vector<const_glslang::TVector<glslang::HlslToken>_*,_glslang::pool_allocator<const_glslang::TVector<glslang::HlslToken>_*>_>
         .
         super__Vector_base<const_glslang::TVector<glslang::HlslToken>_*,_glslang::pool_allocator<const_glslang::TVector<glslang::HlslToken>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position_00._M_current ==
        (this->tokenStreamStack).
        super_vector<const_glslang::TVector<glslang::HlslToken>_*,_glslang::pool_allocator<const_glslang::TVector<glslang::HlslToken>_*>_>
        .
        super__Vector_base<const_glslang::TVector<glslang::HlslToken>_*,_glslang::pool_allocator<const_glslang::TVector<glslang::HlslToken>_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<glslang::TVector<glslang::HlslToken>const*,glslang::pool_allocator<glslang::TVector<glslang::HlslToken>const*>>
      ::_M_realloc_insert<glslang::TVector<glslang::HlslToken>const*const&>
                ((vector<glslang::TVector<glslang::HlslToken>const*,glslang::pool_allocator<glslang::TVector<glslang::HlslToken>const*>>
                  *)&this->tokenStreamStack,__position_00,&local_20);
    }
    else {
      *__position_00._M_current = local_20;
      pppTVar1 = &(this->tokenStreamStack).
                  super_vector<const_glslang::TVector<glslang::HlslToken>_*,_glslang::pool_allocator<const_glslang::TVector<glslang::HlslToken>_*>_>
                  .
                  super__Vector_base<const_glslang::TVector<glslang::HlslToken>_*,_glslang::pool_allocator<const_glslang::TVector<glslang::HlslToken>_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar1 = *pppTVar1 + 1;
    }
    pHVar3 = (local_20->
             super_vector<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>).
             super__Vector_base<glslang::HlslToken,_glslang::pool_allocator<glslang::HlslToken>_>.
             _M_impl.super__Vector_impl_data._M_start;
    (this->token).field_2 = pHVar3->field_2;
    pTVar4 = (pHVar3->loc).name;
    iVar8 = (pHVar3->loc).string;
    iVar9 = (pHVar3->loc).line;
    uVar5 = *(undefined4 *)&(pHVar3->loc).field_0x14;
    EVar6 = pHVar3->tokenClass;
    uVar7 = *(undefined4 *)&pHVar3->field_0x1c;
    (this->token).loc.column = (pHVar3->loc).column;
    *(undefined4 *)&(this->token).loc.field_0x14 = uVar5;
    (this->token).tokenClass = EVar6;
    *(undefined4 *)&(this->token).field_0x1c = uVar7;
    (__args->loc).name = pTVar4;
    (this->token).loc.string = iVar8;
    (this->token).loc.line = iVar9;
    local_14 = 0;
    __position_01._M_current =
         (this->tokenPosition).super_vector<int,_glslang::pool_allocator<int>_>.
         super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    if (__position_01._M_current ==
        (this->tokenPosition).super_vector<int,_glslang::pool_allocator<int>_>.
        super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,_glslang::pool_allocator<int>_>::_M_realloc_insert<int>
                (&(this->tokenPosition).super_vector<int,_glslang::pool_allocator<int>_>,
                 __position_01,&local_14);
    }
    else {
      *__position_01._M_current = 0;
      (this->tokenPosition).super_vector<int,_glslang::pool_allocator<int>_>.
      super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = __position_01._M_current + 1;
    }
    return;
  }
  __assert_fail("preTokenStackSize == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslTokenStream.cpp"
                ,0x4e,"void glslang::HlslTokenStream::pushTokenStream(const TVector<HlslToken> *)");
}

Assistant:

void HlslTokenStream::pushTokenStream(const TVector<HlslToken>* tokens)
{
    // not yet setup to interrupt a stream that has been receded
    // and not yet reconsumed
    assert(preTokenStackSize == 0);

    // save current state
    currentTokenStack.push_back(token);

    // set up new token stream
    tokenStreamStack.push_back(tokens);

    // start position at first token:
    token = (*tokens)[0];
    tokenPosition.push_back(0);
}